

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslcertificate.cpp
# Opt level: O2

int QSslCertificate::verify(EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  QTlsBackend *pQVar1;
  code *pcVar2;
  QLoggingCategory *pQVar3;
  char *pcVar4;
  long in_FS_OFFSET;
  char local_40 [24];
  char *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = QTlsBackend::activeOrAnyBackend();
  if (pQVar1 == (QTlsBackend *)0x0) {
    pQVar3 = QtPrivateLogging::lcSsl();
    if (((pQVar3->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
      local_28 = pQVar3->name;
      pcVar4 = "No TLS backend is available";
LAB_001bf968:
      local_40[0x14] = '\0';
      local_40[0x15] = '\0';
      local_40[0x16] = '\0';
      local_40[0x17] = '\0';
      local_40[0xc] = '\0';
      local_40[0xd] = '\0';
      local_40[0xe] = '\0';
      local_40[0xf] = '\0';
      local_40[0x10] = '\0';
      local_40[0x11] = '\0';
      local_40[0x12] = '\0';
      local_40[0x13] = '\0';
      local_40[4] = '\0';
      local_40[5] = '\0';
      local_40[6] = '\0';
      local_40[7] = '\0';
      local_40[8] = '\0';
      local_40[9] = '\0';
      local_40[10] = '\0';
      local_40[0xb] = '\0';
      local_40[0] = '\x02';
      local_40[1] = '\0';
      local_40[2] = '\0';
      local_40[3] = '\0';
      QMessageLogger::warning(local_40,pcVar4);
    }
  }
  else {
    pcVar2 = (code *)(**(code **)(*(long *)pQVar1 + 0xe0))(pQVar1);
    if (pcVar2 != (code *)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) != local_20) goto LAB_001bf971;
      (*pcVar2)(ctx,sig,siglen);
      goto LAB_001bf936;
    }
    pQVar3 = QtPrivateLogging::lcSsl();
    if (((pQVar3->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
      local_28 = pQVar3->name;
      pcVar4 = "Available TLS backend does not support manual certificate verification";
      goto LAB_001bf968;
    }
  }
  *(undefined8 *)ctx = 0;
  *(undefined8 *)(ctx + 8) = 0;
  *(undefined8 *)(ctx + 0x10) = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
LAB_001bf971:
    __stack_chk_fail();
  }
LAB_001bf936:
  return (int)ctx;
}

Assistant:

QList<QSslError> QSslCertificate::verify(const QList<QSslCertificate> &certificateChain, const QString &hostName)
{
    const auto *tlsBackend = QTlsBackend::activeOrAnyBackend();
    if (!tlsBackend) {
        qCWarning(lcSsl, "No TLS backend is available");
        return {};
    }
    auto verifyPtr = tlsBackend->X509Verifier();
    if (!verifyPtr) {
        qCWarning(lcSsl, "Available TLS backend does not support manual certificate verification");
        return {};
    }
    return verifyPtr(certificateChain, hostName);
}